

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

cmTarget * __thiscall cmMakefile::AddNewTarget(cmMakefile *this,TargetType type,string *name)

{
  cmTarget *t;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>,_bool>
  pVar1;
  cmStateDirectory local_60;
  cmStateSnapshot local_38;
  
  cmTarget::cmTarget((cmTarget *)&local_60,name,type,VisibilityNormal,this);
  pVar1 = std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmTarget>,std::allocator<std::pair<std::__cxx11::string_const,cmTarget>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::_M_emplace<std::__cxx11::string_const&,cmTarget>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmTarget>,std::allocator<std::pair<std::__cxx11::string_const,cmTarget>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)&this->Targets,name,&local_60);
  cmTarget::~cmTarget((cmTarget *)&local_60);
  t = (cmTarget *)
      ((long)pVar1.first.
             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
             ._M_cur.
             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
      + 0x28);
  cmGlobalGenerator::IndexTarget(this->GlobalGenerator,t);
  local_38.Position.Position = (this->StateSnapshot).Position.Position;
  local_38.State = (this->StateSnapshot).State;
  local_38.Position.Tree = (this->StateSnapshot).Position.Tree;
  cmStateSnapshot::GetDirectory(&local_60,&local_38);
  cmStateDirectory::AddNormalTargetName(&local_60,name);
  return t;
}

Assistant:

cmTarget* cmMakefile::AddNewTarget(cmStateEnums::TargetType type,
                                   const std::string& name)
{
  cmTargetMap::iterator it =
    this->Targets
      .emplace(name, cmTarget(name, type, cmTarget::VisibilityNormal, this))
      .first;
  this->GetGlobalGenerator()->IndexTarget(&it->second);
  this->GetStateSnapshot().GetDirectory().AddNormalTargetName(name);
  return &it->second;
}